

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

void __thiscall
ActionPrototypeTypes::extendInput
          (ActionPrototypeTypes *this,Funcdata *data,Varnode *invn,ProtoParameter *param,
          BlockBasic *topbl)

{
  ParamList *pPVar1;
  OpCode opc;
  int iVar2;
  undefined4 extraout_var;
  PcodeOp *op;
  Address local_58;
  VarnodeData vdata;
  
  pPVar1 = ((data->funcp).model)->input;
  opc = (*pPVar1->_vptr_ParamList[0xc])(pPVar1,&invn->loc,(ulong)(uint)invn->size,&vdata);
  if (opc != CPUI_COPY) {
    if (opc == CPUI_PIECE) {
      iVar2 = (*param->_vptr_ProtoParameter[3])(param);
      opc = (*(int *)(CONCAT44(extraout_var,iVar2) + 0x30) == 7) + CPUI_INT_ZEXT;
    }
    (*(topbl->super_FlowBlock)._vptr_FlowBlock[2])(&local_58,topbl);
    op = Funcdata::newOp(data,1,&local_58);
    local_58.base = vdata.space;
    local_58.offset = vdata.offset;
    Funcdata::newVarnodeOut(data,vdata.size,&local_58,op);
    Funcdata::opSetOpcode(data,op,opc);
    Funcdata::opSetInput(data,op,invn,0);
    Funcdata::opInsertBegin(data,op,topbl);
  }
  return;
}

Assistant:

void ActionPrototypeTypes::extendInput(Funcdata &data,Varnode *invn,ProtoParameter *param,BlockBasic *topbl)

{
  VarnodeData vdata;
  OpCode res = data.getFuncProto().assumedInputExtension(invn->getAddr(),invn->getSize(),vdata);
  if (res == CPUI_COPY) return;		// no extension
  if (res == CPUI_PIECE) {	// Do an extension based on type of parameter
    if (param->getType()->getMetatype() == TYPE_INT)
      res = CPUI_INT_SEXT;
    else
      res = CPUI_INT_ZEXT;
  }
  PcodeOp *op = data.newOp(1,topbl->getStart());
  data.newVarnodeOut(vdata.size,vdata.getAddr(),op);
  data.opSetOpcode(op,res);
  data.opSetInput(op,invn,0);
  data.opInsertBegin(op,topbl);
}